

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# twentytwenty.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  basic_string_view<char,_std::char_traits<char>_> __str;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  byte bVar2;
  bool bVar3;
  ostream *poVar4;
  const_iterator pvVar5;
  basic_ostream<char,_std::char_traits<char>_> *this;
  istream *piVar6;
  size_type __n;
  iterator iVar7;
  const_iterator __last;
  reference piVar8;
  ijk local_3d4;
  int *local_3c8;
  int *local_3c0;
  int local_3b8;
  __unspec local_3b2;
  type local_3b1;
  int k;
  const_iterator j_1;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_390;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> ub;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_380;
  type local_371;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_370;
  const_iterator i_1;
  vector<ijk,_std::allocator<ijk>_> matching_triples;
  ij local_338;
  int *local_330;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_328;
  int local_320;
  __unspec local_319;
  int j;
  type local_309;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_308;
  const_iterator i;
  vector<ij,_std::allocator<ij>_> matching_pairs;
  allocator<int> local_2b1;
  undefined1 local_2b0 [8];
  vector<int,_std::allocator<int>_> input;
  string line;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  istream local_238 [8];
  ifstream file;
  undefined1 auStack_30 [8];
  string_view path;
  int twenty20;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  path._M_str._4_4_ = 0x7e4;
  if (argc == 2) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)auStack_30,argv[1]);
    pvVar5 = std::basic_string_view<char,_std::char_traits<char>_>::begin
                       ((basic_string_view<char,_std::char_traits<char>_> *)auStack_30);
    std::ifstream::ifstream(local_238,pvVar5,8);
    bVar2 = std::ios::good();
    if ((bVar2 & 1) == 0) {
      poVar4 = std::operator<<((ostream *)&std::cout,"Could not open ");
      __str._M_str = (char *)path._M_len;
      __str._M_len = (size_t)auStack_30;
      this = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)poVar4,__str);
      std::ostream::operator<<((ostream *)this,std::endl<char,std::char_traits<char>>);
      argv_local._4_4_ = 1;
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&line.field_2 + 8));
      std::__cxx11::string::string
                ((string *)
                 &input.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      while( true ) {
        piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           (local_238,
                            (string *)
                            &input.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage);
        bVar3 = std::ios::operator_cast_to_bool
                          ((ios *)(piVar6 + *(long *)(*(long *)piVar6 + -0x18)));
        if (!bVar3) break;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&line.field_2 + 8),
                    (value_type *)
                    &input.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
      }
      std::__cxx11::string::~string
                ((string *)
                 &input.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      __n = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)((long)&line.field_2 + 8));
      std::allocator<int>::allocator(&local_2b1);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)local_2b0,__n,&local_2b1);
      std::allocator<int>::~allocator(&local_2b1);
      iVar7 = std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)local_2b0);
      std::ranges::__transform_fn::
      operator()<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_tomlankhorst[P]advent_of_code_2020_cpp_day01_twentytwenty_cpp:31:49),_std::identity>
                ((__transform_fn *)&std::ranges::transform,(undefined1 *)((long)&line.field_2 + 8),
                 iVar7._M_current);
      std::ranges::__sort_fn::
      operator()<std::vector<int,_std::allocator<int>_>_&,_std::ranges::less,_std::identity>
                ((__sort_fn *)&std::ranges::sort,local_2b0);
      std::vector<ij,_std::allocator<ij>_>::vector((vector<ij,_std::allocator<ij>_> *)&i);
      local_308._M_current =
           (int *)std::vector<int,_std::allocator<int>_>::cbegin
                            ((vector<int,_std::allocator<int>_> *)local_2b0);
      while( true ) {
        _j = std::vector<int,_std::allocator<int>_>::cend
                       ((vector<int,_std::allocator<int>_> *)local_2b0);
        local_309 = (type)__gnu_cxx::operator<=><int_const*,std::vector<int,std::allocator<int>>>
                                    (&local_308,
                                     (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                      *)&j);
        std::__cmp_cat::__unspec::__unspec(&local_319,(__unspec *)0x0);
        bVar3 = std::operator<(local_309);
        if (!bVar3) break;
        piVar8 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                 ::operator*(&local_308);
        local_320 = 0x7e4 - *piVar8;
        if (-1 < local_320) {
          local_328._M_current = local_308._M_current;
          local_330 = (int *)std::vector<int,_std::allocator<int>_>::cend
                                       ((vector<int,_std::allocator<int>_> *)local_2b0);
          bVar3 = std::
                  binary_search<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,int>
                            (local_328,
                             (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                              )local_330,&local_320);
          if (bVar3) {
            piVar8 = __gnu_cxx::
                     __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                     operator*(&local_308);
            local_338.i = *piVar8;
            local_338.j = local_320;
            std::vector<main::ij,std::allocator<main::ij>>::emplace_back<main::ij>
                      ((vector<main::ij,std::allocator<main::ij>> *)&i,&local_338);
          }
        }
        __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
        operator++(&local_308,0);
      }
      std::ranges::__for_each_fn::
      operator()<std::vector<ij,_std::allocator<ij>_>_&,_std::identity,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_tomlankhorst[P]advent_of_code_2020_cpp_day01_twentytwenty_cpp:47:36)>
                ((__for_each_fn *)&std::ranges::for_each,&i);
      std::vector<ijk,_std::allocator<ijk>_>::vector((vector<ijk,_std::allocator<ijk>_> *)&i_1);
      local_370._M_current =
           (int *)std::vector<int,_std::allocator<int>_>::cbegin
                            ((vector<int,_std::allocator<int>_> *)local_2b0);
      while( true ) {
        local_380._M_current =
             (int *)std::vector<int,_std::allocator<int>_>::cend
                              ((vector<int,_std::allocator<int>_> *)local_2b0);
        local_371 = (type)__gnu_cxx::operator<=><int_const*,std::vector<int,std::allocator<int>>>
                                    (&local_370,&local_380);
        std::__cmp_cat::__unspec::__unspec((__unspec *)((long)&ub._M_current + 7),(__unspec *)0x0);
        bVar3 = std::operator<(local_371);
        __first._M_current = local_370._M_current;
        if (!bVar3) break;
        __last = std::vector<int,_std::allocator<int>_>::cend
                           ((vector<int,_std::allocator<int>_> *)local_2b0);
        piVar8 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                 ::operator*(&local_370);
        j_1._M_current._4_4_ = 0x7e4 - *piVar8;
        local_390 = std::
                    upper_bound<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,int>
                              (__first,__last._M_current,(int *)((long)&j_1._M_current + 4));
        _k = local_370._M_current;
        while( true ) {
          local_3b1 = (type)__gnu_cxx::operator<=><int_const*,std::vector<int,std::allocator<int>>>
                                      ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                        *)&k,&local_390);
          std::__cmp_cat::__unspec::__unspec(&local_3b2,(__unspec *)0x0);
          bVar3 = std::operator<(local_3b1);
          if (!bVar3) break;
          piVar8 = __gnu_cxx::
                   __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&local_370);
          iVar1 = *piVar8;
          piVar8 = __gnu_cxx::
                   __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                              *)&k);
          local_3b8 = (0x7e4 - iVar1) - *piVar8;
          if (-1 < local_3b8) {
            local_3c0 = _k;
            local_3c8 = local_390._M_current;
            bVar3 = std::
                    binary_search<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,int>
                              (_k,local_390,&local_3b8);
            if (bVar3) {
              piVar8 = __gnu_cxx::
                       __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                       operator*(&local_370);
              local_3d4.i = *piVar8;
              piVar8 = __gnu_cxx::
                       __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                       operator*((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                  *)&k);
              local_3d4.j = *piVar8;
              local_3d4.k = local_3b8;
              std::vector<main::ijk,std::allocator<main::ijk>>::emplace_back<main::ijk>
                        ((vector<main::ijk,std::allocator<main::ijk>> *)&i_1,&local_3d4);
            }
          }
          __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
          operator++((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)&k,0
                    );
        }
        __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
        operator++(&local_370,0);
      }
      std::ranges::__for_each_fn::
      operator()<std::vector<ijk,_std::allocator<ijk>_>_&,_std::identity,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_tomlankhorst[P]advent_of_code_2020_cpp_day01_twentytwenty_cpp:67:38)>
                ((__for_each_fn *)&std::ranges::for_each,&i_1);
      std::vector<ijk,_std::allocator<ijk>_>::~vector((vector<ijk,_std::allocator<ijk>_> *)&i_1);
      std::vector<ij,_std::allocator<ij>_>::~vector((vector<ij,_std::allocator<ij>_> *)&i);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)local_2b0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&line.field_2 + 8));
    }
    std::ifstream::~ifstream(local_238);
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cout,"usage: ");
    poVar4 = std::operator<<(poVar4,*argv);
    poVar4 = std::operator<<(poVar4," path-to-input");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    argv_local._4_4_ = 0;
  }
  return argv_local._4_4_;
}

Assistant:

auto main(int argc, char* argv[]) -> int {
  namespace ranges = std::ranges;

  constexpr auto twenty20 = 2020;

  if (argc != 2) {
    std::cout << "usage: " << argv[0] << " path-to-input" << std::endl;
    return 0;
  }

  std::string_view path = argv[1];

  auto file = std::ifstream{path.begin()};

  if (!file.good()) {
    std::cout << "Could not open " << path << std::endl;
    return 1;
  }

  std::vector<std::string> tokens;
  for (std::string line; std::getline(file, line);)
    tokens.push_back(line);

  std::vector<int> input (tokens.size());
  std::ranges::transform(tokens, input.begin(), [](const auto& line){
    return std::stoi(line);
  });

  ranges::sort(input);

  struct ij { int i, j; };
  std::vector<ij> matching_pairs;
  // for all items `i`
  for (auto i = input.cbegin(); i < input.cend(); i++) {
    // determine whether `2020-i` is in the input
    auto j = twenty20 - *i;
    if (j >= 0 && std::binary_search(i, input.cend(), j) )
      matching_pairs.emplace_back(ij{*i,j});
  }

  ranges::for_each(matching_pairs, [](const auto& ij){
    auto& [i, j] = ij;
    std::cout << "i: " << i << ", j: " << j << ", i*j: " << i*j << std::endl;
  });

  struct ijk { int i, j, k; };
  std::vector<ijk> matching_triples;
  // for all items `i`
  for (auto i = input.cbegin(); i < input.cend(); i++) {
    // find the upper bound `ub` s.t. `i+j <= 2020`
    // and for all items `j` in the range `[i,ub]`
    auto ub = std::upper_bound(i, input.cend(), twenty20 - *i);
    for (auto j = i; j < ub; j++) {
      // determine whether 2020-i-j is in the list
      auto k = twenty20 - *i - *j;
      if (k >= 0 && std::binary_search(j, ub, k))
        matching_triples.emplace_back(ijk{*i, *j, k});
    }
  }

  ranges::for_each(matching_triples, [](const auto& ijk){
    auto& [i,j,k] = ijk;
    std::cout <<
              "i: " << i << ", " <<
              "j: " << j << ", " <<
              "k: " << k << ", " <<
              "i*j*k: " << i*j*k << std::endl;
  });

}